

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

void __thiscall Mat::clear(Mat *this)

{
  vector<__int128,_std::allocator<__int128>_> *__x;
  int *in_RDI;
  allocator_type *__a;
  size_type in_stack_ffffffffffffffc8;
  vector<__int128,_std::allocator<__int128>_> *in_stack_ffffffffffffffd0;
  allocator_type local_21 [33];
  
  __x = (vector<__int128,_std::allocator<__int128>_> *)(long)(*in_RDI * in_RDI[1]);
  __a = local_21;
  std::allocator<__int128>::allocator((allocator<__int128> *)0x110401);
  std::vector<__int128,_std::allocator<__int128>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,__a);
  std::vector<__int128,_std::allocator<__int128>_>::operator=
            ((vector<__int128,_std::allocator<__int128>_> *)__a,__x);
  std::vector<__int128,_std::allocator<__int128>_>::~vector
            ((vector<__int128,_std::allocator<__int128>_> *)__a);
  std::allocator<__int128>::~allocator((allocator<__int128> *)0x11043e);
  return;
}

Assistant:

void Mat::clear() {
    val = vector<ll128>(r * c);
}